

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O2

int Am_Vertical_Layout_proc(Am_Object *self)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int primary_spacing;
  int iVar5;
  int iVar6;
  int iVar7;
  Am_Value *pAVar8;
  ostream *poVar9;
  int iVar10;
  char *pcVar11;
  int indent;
  int iVar12;
  int local_c0;
  int local_bc;
  Am_Alignment v_align;
  Am_Alignment h_align;
  Am_Value_List components;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object component;
  int line_width;
  int line_rank;
  int max_size;
  int max_rank;
  int fixed_height;
  int fixed_width;
  Am_Object item;
  
  Am_Value_List::Am_Value_List(&components);
  pAVar8 = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=(&components,pAVar8);
  component.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&components);
  while( true ) {
    bVar2 = Am_Value_List::Last(&components);
    if (bVar2) break;
    pAVar8 = Am_Value_List::Get(&components);
    Am_Object::operator=(&component,pAVar8);
    pAVar8 = Am_Object::Get(&component,0x69,0);
    bVar2 = Am_Value::operator_cast_to_bool(pAVar8);
    if (!bVar2) {
      Am_Value_List::Delete(&components,true);
    }
    Am_Value_List::Next(&components);
  }
  Am_Object::Am_Object(&local_88,self);
  get_fixed_sizes(&local_88,&components,&fixed_width,&fixed_height);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Am_Object(&local_90,self);
  get_max_rank_and_size(&local_90,&max_rank,&max_size);
  Am_Object::~Am_Object(&local_90);
  pAVar8 = Am_Object::Get(self,0x9f,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x9e,0);
  local_c0 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x95,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x96,0);
  primary_spacing = Am_Value::operator_cast_to_int(pAVar8);
  pAVar8 = Am_Object::Get(self,0x97,0);
  Am_Alignment::Am_Alignment(&h_align,pAVar8);
  pAVar8 = Am_Object::Get(self,0x98,0);
  Am_Alignment::Am_Alignment(&v_align,pAVar8);
  pAVar8 = Am_Object::Get(self,0x9b,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar8);
  Am_Value_List::Start(&components);
  indent = iVar3;
  do {
    bVar2 = Am_Value_List::Last(&components);
    if (bVar2) {
      Am_Object::~Am_Object(&component);
      Am_Value_List::~Am_Value_List(&components);
      return 0;
    }
    find_line_size_and_rank
              (&components,indent,fixed_height,0x67,primary_spacing,0x66,max_rank,max_size,
               &line_rank,&line_width);
    iVar1 = line_rank;
    local_bc = fixed_width;
    if (fixed_width == 0) {
      local_bc = line_width;
    }
    iVar12 = 0;
    while (iVar12 < iVar1) {
      item.data = (Am_Object_Data *)0x0;
      pAVar8 = Am_Value_List::Get(&components);
      Am_Object::operator=(&item,pAVar8);
      pAVar8 = Am_Object::Get(&item,0x69,0);
      bVar2 = Am_Value::operator_cast_to_bool(pAVar8);
      if (bVar2) {
        pAVar8 = Am_Object::Get(&item,0x66,0);
        iVar6 = Am_Value::operator_cast_to_int(pAVar8);
        pAVar8 = Am_Object::Get(&item,0x67,0);
        iVar7 = Am_Value::operator_cast_to_int(pAVar8);
        iVar10 = indent;
        if (fixed_height != 0) {
          if (v_align.value == Am_CENTER_ALIGN_val) {
            iVar10 = (fixed_height - iVar7) / 2 + indent;
          }
          else if (v_align.value != Am_TOP_ALIGN_val) {
            if (v_align.value != Am_BOTTOM_ALIGN_val) {
              poVar9 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
              poVar9 = std::operator<<(poVar9,"Bad alignment value ");
              poVar9 = operator<<(poVar9,&v_align);
              pcVar11 = " in Am_V_ALIGN of ";
              goto LAB_001db7d4;
            }
            iVar10 = (indent + fixed_height) - iVar7;
          }
        }
        Am_Object::Set(&item,0x65,iVar10,0);
        if (h_align.value == Am_CENTER_ALIGN_val) {
          iVar10 = (local_bc - iVar6) / 2 + local_c0;
        }
        else if (h_align.value == Am_RIGHT_ALIGN_val) {
          iVar10 = (local_c0 - iVar6) + local_bc;
        }
        else {
          iVar10 = local_c0;
          if (h_align.value != Am_LEFT_ALIGN_val) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
            poVar9 = std::operator<<(poVar9,"Bad alignment value ");
            poVar9 = operator<<(poVar9,&h_align);
            pcVar11 = " in Am_H_ALIGN of ";
LAB_001db7d4:
            poVar9 = std::operator<<(poVar9,pcVar11);
            poVar9 = operator<<(poVar9,self);
            std::endl<char,std::char_traits<char>>(poVar9);
            Am_Error();
          }
        }
        Am_Object::Set(&item,100,iVar10,0);
        if (fixed_height != 0) {
          iVar7 = fixed_height;
        }
        indent = indent + primary_spacing + iVar7;
        iVar12 = iVar12 + 1;
      }
      Am_Value_List::Next(&components);
      Am_Object::~Am_Object(&item);
    }
    local_c0 = local_c0 + iVar4 + local_bc;
    indent = iVar5 + iVar3;
  } while( true );
}

Assistant:

Am_Define_Formula(int, Am_Vertical_Layout)
{
  Am_Value_List components;
  components = self.Get(Am_GRAPHICAL_PARTS);
  Am_Object component;
  for (components.Start(); !components.Last(); components.Next()) {
    component = components.Get();
    if (!(bool)component.Get(Am_VISIBLE))
      components.Delete();
  }
  int fixed_width, fixed_height;
  get_fixed_sizes(self, components, fixed_width, fixed_height);
  int max_rank, max_size;
  get_max_rank_and_size(self, max_rank, max_size);
  int top_offset = self.Get(Am_TOP_OFFSET);
  int left = self.Get(Am_LEFT_OFFSET);
  int top = top_offset;
  int h_spacing = self.Get(Am_H_SPACING);
  int v_spacing = self.Get(Am_V_SPACING);
  Am_Alignment h_align = self.Get(Am_H_ALIGN);
  Am_Alignment v_align = self.Get(Am_V_ALIGN);
  int indent = self.Get(Am_INDENT);
  components.Start();
  while (!components.Last()) {
    int line_rank;
    int line_width;
    find_line_size_and_rank(components, top, fixed_height, Am_HEIGHT, v_spacing,
                            Am_WIDTH, max_rank, max_size, line_rank,
                            line_width);
    int rank = 0;
    while (rank < line_rank) {
      Am_Object item;
      item = components.Get();
      if ((bool)item.Get(Am_VISIBLE)) {
        int width = item.Get(Am_WIDTH);
        int height = item.Get(Am_HEIGHT);
        if (fixed_height) {
          switch (v_align.value) {
          case Am_TOP_ALIGN_val:
            item.Set(Am_TOP, top);
            break;
          case Am_BOTTOM_ALIGN_val:
            item.Set(Am_TOP, top + fixed_height - height);
            break;
          case Am_CENTER_ALIGN_val:
            item.Set(Am_TOP, top + (fixed_height - height) / 2);
            break;
          default:
            Am_ERRORO("Bad alignment value " << v_align << " in Am_V_ALIGN of "
                                             << self,
                      self, Am_V_ALIGN);
          }
        } else
          item.Set(Am_TOP, top);
        switch (h_align.value) {
        case Am_LEFT_ALIGN_val:
          item.Set(Am_LEFT, left);
          break;
        case Am_RIGHT_ALIGN_val:
          item.Set(Am_LEFT,
                   left + (fixed_width ? fixed_width : line_width) - width);
          break;
        case Am_CENTER_ALIGN_val:
          item.Set(Am_LEFT,
                   left +
                       ((fixed_width ? fixed_width : line_width) - width) / 2);
          break;
        default:
          Am_ERRORO("Bad alignment value " << h_align << " in Am_H_ALIGN of "
                                           << self,
                    self, Am_H_ALIGN);
        }
        top += (fixed_height ? fixed_height : height) + v_spacing;
        ++rank;
      }
      components.Next();
    }
    left += (fixed_width ? fixed_width : line_width) + h_spacing;
    top = top_offset + indent;
  }
  return 0;
}